

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O3

void __thiscall fasttext::FastText::trainThread(FastText *this,int32_t threadId)

{
  model_name mVar1;
  element_type *peVar2;
  int32_t iVar3;
  int64_t iVar4;
  long lVar5;
  float lr;
  real rVar6;
  vector<int,_std::allocator<int>_> labels;
  vector<int,_std::allocator<int>_> line;
  State state;
  ifstream ifs;
  vector<int,_std::allocator<int>_> local_2d8;
  vector<int,_std::allocator<int>_> local_2b8;
  State local_298;
  ifstream local_238 [520];
  
  std::ifstream::ifstream
            (local_238,
             (string *)
             (this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             _S_in);
  iVar4 = utils::size(local_238);
  utils::seek(local_238,
              (iVar4 * threadId) /
              (long)((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->thread);
  iVar3 = ((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->dim
  ;
  iVar4 = Matrix::size((this->output_).
                       super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr,0);
  Model::State::State(&local_298,iVar3,(int32_t)iVar4,threadId);
  iVar4 = Dictionary::ntokens((this->dict_).
                              super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr);
  local_2b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_2d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_2b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_2b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_2d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_2d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  if ((this->tokenCount_).super___atomic_base<long>._M_i <
      ((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->epoch *
      iVar4) {
    lVar5 = 0;
    do {
      peVar2 = (this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      mVar1 = peVar2->model;
      lr = (float)((1.0 - (double)((float)(this->tokenCount_).super___atomic_base<long>._M_i /
                                  (float)(peVar2->epoch * iVar4))) * peVar2->lr);
      if (mVar1 == cbow) {
        iVar3 = Dictionary::getLine((this->dict_).
                                    super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr,(istream *)local_238,&local_2b8,&local_298.rng);
        cbow(this,&local_298,lr,&local_2b8);
LAB_0012537b:
        lVar5 = lVar5 + iVar3;
      }
      else {
        if (mVar1 == sg) {
          iVar3 = Dictionary::getLine((this->dict_).
                                      super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr,(istream *)local_238,&local_2b8,&local_298.rng);
          skipgram(this,&local_298,lr,&local_2b8);
          goto LAB_0012537b;
        }
        if (mVar1 == sup) {
          iVar3 = Dictionary::getLine((this->dict_).
                                      super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr,(istream *)local_238,&local_2b8,&local_2d8);
          supervised(this,&local_298,lr,&local_2b8,&local_2d8);
          goto LAB_0012537b;
        }
      }
      if (((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          lrUpdateRate < lVar5) {
        LOCK();
        (this->tokenCount_).super___atomic_base<long>._M_i =
             (this->tokenCount_).super___atomic_base<long>._M_i + lVar5;
        UNLOCK();
        if ((threadId == 0) &&
           (1 < ((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                )->verbose)) {
          rVar6 = Model::State::getLoss(&local_298);
          LOCK();
          (this->loss_)._M_i = rVar6;
          UNLOCK();
        }
        lVar5 = 0;
      }
    } while ((this->tokenCount_).super___atomic_base<long>._M_i <
             ((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             epoch * iVar4);
  }
  if (threadId == 0) {
    rVar6 = Model::State::getLoss(&local_298);
    LOCK();
    (this->loss_)._M_i = rVar6;
    UNLOCK();
  }
  std::ifstream::close();
  if (local_2d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_2d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_2b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_2b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_298.grad.data_.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_298.grad.data_.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_298.output.data_.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_298.output.data_.super__Vector_base<float,_std::allocator<float>_>._M_impl
                    .super__Vector_impl_data._M_start);
  }
  if (local_298.hidden.data_.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_298.hidden.data_.super__Vector_base<float,_std::allocator<float>_>._M_impl
                    .super__Vector_impl_data._M_start);
  }
  std::ifstream::~ifstream(local_238);
  return;
}

Assistant:

void FastText::trainThread(int32_t threadId) {
  std::ifstream ifs(args_->input);
  utils::seek(ifs, threadId * utils::size(ifs) / args_->thread);

  Model::State state(args_->dim, output_->size(0), threadId);

  const int64_t ntokens = dict_->ntokens();
  int64_t localTokenCount = 0;
  std::vector<int32_t> line, labels;
  while (tokenCount_ < args_->epoch * ntokens) {
    real progress = real(tokenCount_) / (args_->epoch * ntokens);
    real lr = args_->lr * (1.0 - progress);
    if (args_->model == model_name::sup) {
      localTokenCount += dict_->getLine(ifs, line, labels);
      supervised(state, lr, line, labels);
    } else if (args_->model == model_name::cbow) {
      localTokenCount += dict_->getLine(ifs, line, state.rng);
      cbow(state, lr, line);
    } else if (args_->model == model_name::sg) {
      localTokenCount += dict_->getLine(ifs, line, state.rng);
      skipgram(state, lr, line);
    }
    if (localTokenCount > args_->lrUpdateRate) {
      tokenCount_ += localTokenCount;
      localTokenCount = 0;
      if (threadId == 0 && args_->verbose > 1)
        loss_ = state.getLoss();
    }
  }
  if (threadId == 0)
    loss_ = state.getLoss();
  ifs.close();
}